

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O0

int IDASetId(void *ida_mem,N_Vector id)

{
  undefined8 uVar1;
  long in_RSI;
  long in_RDI;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x21f,"IDASetId",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RSI == 0) {
    if (*(int *)(in_RDI + 0x69c) != 0) {
      N_VDestroy(*(undefined8 *)(in_RDI + 0x2a8));
      *(long *)(in_RDI + 0x678) = *(long *)(in_RDI + 0x678) - *(long *)(in_RDI + 0x658);
      *(long *)(in_RDI + 0x680) = *(long *)(in_RDI + 0x680) - *(long *)(in_RDI + 0x660);
    }
    *(undefined4 *)(in_RDI + 0x69c) = 0;
    local_4 = 0;
  }
  else {
    if (*(int *)(in_RDI + 0x69c) == 0) {
      uVar1 = N_VClone(in_RSI);
      *(undefined8 *)(in_RDI + 0x2a8) = uVar1;
      *(long *)(in_RDI + 0x678) = *(long *)(in_RDI + 0x658) + *(long *)(in_RDI + 0x678);
      *(long *)(in_RDI + 0x680) = *(long *)(in_RDI + 0x660) + *(long *)(in_RDI + 0x680);
      *(undefined4 *)(in_RDI + 0x69c) = 1;
    }
    N_VScale(0x3ff0000000000000,in_RSI,*(undefined8 *)(in_RDI + 0x2a8));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDASetId(void* ida_mem, N_Vector id)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (id == NULL)
  {
    if (IDA_mem->ida_idMallocDone)
    {
      N_VDestroy(IDA_mem->ida_id);
      IDA_mem->ida_lrw -= IDA_mem->ida_lrw1;
      IDA_mem->ida_liw -= IDA_mem->ida_liw1;
    }
    IDA_mem->ida_idMallocDone = SUNFALSE;
    return (IDA_SUCCESS);
  }

  if (!(IDA_mem->ida_idMallocDone))
  {
    IDA_mem->ida_id = N_VClone(id);
    IDA_mem->ida_lrw += IDA_mem->ida_lrw1;
    IDA_mem->ida_liw += IDA_mem->ida_liw1;
    IDA_mem->ida_idMallocDone = SUNTRUE;
  }

  /* Load the id vector */

  N_VScale(ONE, id, IDA_mem->ida_id);

  return (IDA_SUCCESS);
}